

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRangeList.cpp
# Opt level: O3

Error __thiscall
llvm::DWARFDebugRangeList::extract
          (DWARFDebugRangeList *this,DWARFDataExtractor *data,uint64_t *offset_ptr)

{
  size_t *psVar1;
  byte bVar2;
  DWARFObject *pDVar3;
  uint64_t uVar4;
  iterator __position;
  char *pcVar5;
  uint64_t *in_RCX;
  char *Vals;
  error_code EC;
  error_code EC_00;
  uint64_t prev_offset;
  undefined1 auStack_50 [8];
  RangeListEntry Entry;
  
  (data->super_DataExtractor).Data.Data = (char *)0xffffffffffffffff;
  *(undefined1 *)&(data->super_DataExtractor).Data.Length = 0;
  pDVar3 = *(DWARFObject **)&(data->super_DataExtractor).IsLittleEndian;
  if (data->Obj != pDVar3) {
    data->Obj = pDVar3;
  }
  pcVar5 = (char *)*in_RCX;
  if (pcVar5 < (char *)offset_ptr[1]) {
    psVar1 = &(data->super_DataExtractor).Data.Length;
    bVar2 = *(byte *)((long)offset_ptr + 0x11);
    *(byte *)psVar1 = bVar2;
    Entry.SectionIndex = (uint64_t)this;
    if ((bVar2 != 4) && (bVar2 != 8)) {
      pcVar5 = (char *)std::_V2::generic_category();
      uVar4 = Entry.SectionIndex;
      EC_00._M_cat = (error_category *)0x16;
      EC_00._0_8_ = Entry.SectionIndex;
      createStringError<unsigned_char>(EC_00,pcVar5,(uchar *)"invalid address size: %u");
      return (Error)(ErrorInfoBase *)uVar4;
    }
    (data->super_DataExtractor).Data.Data = pcVar5;
    while( true ) {
      Entry.EndAddress = 0xffffffffffffffff;
      uVar4 = *in_RCX;
      auStack_50 = (undefined1  [8])
                   DWARFDataExtractor::getRelocatedValue
                             ((DWARFDataExtractor *)offset_ptr,(uint)bVar2,in_RCX,(uint64_t *)0x0,
                              (Error *)0x0);
      Entry.StartAddress =
           DWARFDataExtractor::getRelocatedValue
                     ((DWARFDataExtractor *)offset_ptr,(uint)*(byte *)((long)offset_ptr + 0x11),
                      in_RCX,&Entry.EndAddress,(Error *)0x0);
      if (*in_RCX != uVar4 + (ulong)(byte)*psVar1 * 2) break;
      if (Entry.StartAddress == 0 && auStack_50 == (undefined1  [8])0x0) {
        *(undefined8 *)Entry.SectionIndex = 1;
        return (Error)(ErrorInfoBase *)Entry.SectionIndex;
      }
      __position._M_current = (RangeListEntry *)data->Obj;
      if (__position._M_current == (RangeListEntry *)data->Section) {
        std::
        vector<llvm::DWARFDebugRangeList::RangeListEntry,std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>>
        ::_M_realloc_insert<llvm::DWARFDebugRangeList::RangeListEntry_const&>
                  ((vector<llvm::DWARFDebugRangeList::RangeListEntry,std::allocator<llvm::DWARFDebugRangeList::RangeListEntry>>
                    *)&(data->super_DataExtractor).IsLittleEndian,__position,
                   (RangeListEntry *)auStack_50);
      }
      else {
        (__position._M_current)->SectionIndex = Entry.EndAddress;
        (__position._M_current)->StartAddress = (uint64_t)auStack_50;
        (__position._M_current)->EndAddress = Entry.StartAddress;
        data->Obj = data->Obj + 1;
      }
      bVar2 = *(byte *)((long)offset_ptr + 0x11);
    }
    (data->super_DataExtractor).Data.Data = (char *)0xffffffffffffffff;
    *(undefined1 *)&(data->super_DataExtractor).Data.Length = 0;
    pDVar3 = *(DWARFObject **)&(data->super_DataExtractor).IsLittleEndian;
    if (data->Obj != pDVar3) {
      data->Obj = pDVar3;
    }
    pcVar5 = (char *)std::_V2::generic_category();
    Vals = "invalid range list entry at offset 0x%lx";
    this = (DWARFDebugRangeList *)Entry.SectionIndex;
  }
  else {
    pcVar5 = (char *)std::_V2::generic_category();
    Vals = "invalid range list offset 0x%lx";
  }
  EC._M_cat = (error_category *)0x16;
  EC._0_8_ = this;
  createStringError<unsigned_long>(EC,pcVar5,(unsigned_long *)Vals);
  return (Error)(ErrorInfoBase *)this;
}

Assistant:

Error DWARFDebugRangeList::extract(const DWARFDataExtractor &data,
                                   uint64_t *offset_ptr) {
  clear();
  if (!data.isValidOffset(*offset_ptr))
    return createStringError(errc::invalid_argument,
                       "invalid range list offset 0x%" PRIx64, *offset_ptr);

  AddressSize = data.getAddressSize();
  if (AddressSize != 4 && AddressSize != 8)
    return createStringError(errc::invalid_argument,
                       "invalid address size: %" PRIu8, AddressSize);
  Offset = *offset_ptr;
  while (true) {
    RangeListEntry Entry;
    Entry.SectionIndex = -1ULL;

    uint64_t prev_offset = *offset_ptr;
    Entry.StartAddress = data.getRelocatedAddress(offset_ptr);
    Entry.EndAddress =
        data.getRelocatedAddress(offset_ptr, &Entry.SectionIndex);

    // Check that both values were extracted correctly.
    if (*offset_ptr != prev_offset + 2 * AddressSize) {
      clear();
      return createStringError(errc::invalid_argument,
                         "invalid range list entry at offset 0x%" PRIx64,
                         prev_offset);
    }
    if (Entry.isEndOfListEntry())
      break;
    Entries.push_back(Entry);
  }
  return Error::success();
}